

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O2

void deqp::gles2::Functional::anon_unknown_0::logProgram
               (TestLog *log,RenderContext *renderCtx,Program *program,ShaderAllocator *shaders)

{
  iterator iVar1;
  Shader *shader;
  ShaderAllocator *__n;
  void *__buf;
  int shaderTypeInt;
  ShaderType shaderType;
  undefined1 local_58 [40];
  
  __n = shaders;
  tcu::LogShaderProgram::LogShaderProgram
            ((LogShaderProgram *)local_58,(program->m_info).linkOk,&(program->m_info).infoLog);
  tcu::LogShaderProgram::write((LogShaderProgram *)local_58,(int)log,__buf,(size_t)__n);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  for (shaderType = SHADERTYPE_VERTEX; shaderType != SHADERTYPE_LAST;
      shaderType = shaderType + SHADERTYPE_FRAGMENT) {
    local_58._0_4_ = shaderType;
    iVar1 = std::
            _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_glu::Shader_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_glu::Shader_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
            ::find(&(shaders->m_shaders)._M_t,(key_type *)local_58);
    if ((_Rb_tree_header *)iVar1._M_node != &(shaders->m_shaders)._M_t._M_impl.super__Rb_tree_header
       ) {
      shader = ShaderAllocator::get(shaders,shaderType);
      logShader(log,renderCtx,shader);
    }
  }
  tcu::TestLog::endShaderProgram(log);
  return;
}

Assistant:

void logProgram (TestLog& log, glu::RenderContext& renderCtx, glu::Program& program, ShaderAllocator& shaders)
{
	log << TestLog::ShaderProgram(program.getLinkStatus(), program.getInfoLog());

	for (int shaderTypeInt = 0; shaderTypeInt < glu::SHADERTYPE_LAST; shaderTypeInt++)
	{
		const glu::ShaderType shaderType = (glu::ShaderType)shaderTypeInt;

		if (shaders.hasShader(shaderType))
			logShader(log, renderCtx, shaders.get(shaderType));
	}

	log << TestLog::EndShaderProgram;
}